

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O3

void slab_arena_destroy(slab_arena *arena)

{
  void *pvVar1;
  ulong *puVar2;
  void *pvVar3;
  void *__e;
  ulong *addr;
  size_t sVar4;
  
  sVar4 = 0;
  while( true ) {
    pvVar1 = (arena->cache).next;
    addr = (ulong *)((ulong)pvVar1 & 0xffffffffffff0000);
    if (addr == (ulong *)0x0) break;
    LOCK();
    pvVar3 = (arena->cache).next;
    if (pvVar1 == pvVar3) {
      (arena->cache).next = (void *)((ulong)pvVar1 & 0xffff | *addr & 0xffffffffffff0000);
      pvVar3 = pvVar1;
    }
    UNLOCK();
    if (pvVar1 == pvVar3) {
      puVar2 = (ulong *)arena->arena;
      if ((addr < puVar2 || puVar2 == (ulong *)0x0) ||
         ((ulong *)((long)puVar2 + arena->prealloc) <= addr)) {
        munmap_checked(addr,(ulong)arena->slab_size);
      }
      sVar4 = sVar4 + arena->slab_size;
    }
  }
  if (arena->arena != (void *)0x0) {
    munmap_checked(arena->arena,arena->prealloc);
  }
  if (sVar4 != arena->used) {
    __assert_fail("total == arena->used",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                  ,0xe9,"void slab_arena_destroy(struct slab_arena *)");
  }
  return;
}

Assistant:

void
slab_arena_destroy(struct slab_arena *arena)
{
	void *ptr;
	size_t total = 0;
	while ((ptr = lf_lifo_pop(&arena->cache))) {
		if (arena->arena == NULL || ptr < arena->arena ||
		    ptr >= arena->arena + arena->prealloc) {
			munmap_checked(ptr, arena->slab_size);
		}
		total += arena->slab_size;
	}
	if (arena->arena)
		munmap_checked(arena->arena, arena->prealloc);

	(void)total;
	assert(total == arena->used);
}